

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::InputFile::initialize(InputFile *this)

{
  InputPartData *pIVar1;
  Data *pDVar2;
  bool bVar3;
  __type_conflict _Var4;
  string *psVar5;
  Box2i *pBVar6;
  DeepScanLineInputFile *pDVar7;
  CompositeDeepScanLine *this_00;
  LineOrder *pLVar8;
  TiledInputFile *this_01;
  ScanLineInputFile *this_02;
  ostream *poVar9;
  ArgExc *pAVar10;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  pIVar1 = this->_data->part;
  bVar3 = Header::hasType(&this->_data->header);
  if (pIVar1 == (InputPartData *)0x0) {
    if (bVar3) {
      psVar5 = Header::type_abi_cxx11_(&this->_data->header);
      _Var4 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)DEEPSCANLINE_abi_cxx11_);
      if (_Var4) {
        pDVar2 = this->_data;
        pDVar2->isTiled = false;
        pBVar6 = Header::dataWindow(&pDVar2->header);
        pDVar2 = this->_data;
        pDVar2->minY = (pBVar6->min).y;
        pDVar2->maxY = (pBVar6->max).y;
        pDVar7 = (DeepScanLineInputFile *)operator_new(0x10);
        DeepScanLineInputFile::DeepScanLineInputFile
                  (pDVar7,&pDVar2->header,pDVar2->_streamData->is,pDVar2->version,pDVar2->numThreads
                  );
        this->_data->dsFile = pDVar7;
        this_00 = (CompositeDeepScanLine *)operator_new(0x10);
        CompositeDeepScanLine::CompositeDeepScanLine(this_00);
        goto LAB_003dac40;
      }
    }
    pDVar2 = this->_data;
    if ((pDVar2->version & 0xa00U) == 0x200) {
      pDVar2->isTiled = true;
      pLVar8 = Header::lineOrder(&pDVar2->header);
      pDVar2 = this->_data;
      pDVar2->lineOrder = *pLVar8;
      pBVar6 = Header::dataWindow(&pDVar2->header);
      pDVar2 = this->_data;
      pDVar2->minY = (pBVar6->min).y;
      pDVar2->maxY = (pBVar6->max).y;
      this_01 = (TiledInputFile *)operator_new(0x10);
      TiledInputFile::TiledInputFile
                (this_01,&pDVar2->header,pDVar2->_streamData->is,pDVar2->version,pDVar2->numThreads)
      ;
LAB_003dad35:
      this->_data->tFile = this_01;
      return;
    }
    bVar3 = Header::hasType(&pDVar2->header);
    if (bVar3) {
      psVar5 = Header::type_abi_cxx11_(&this->_data->header);
      _Var4 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)SCANLINEIMAGE_abi_cxx11_);
      if (!_Var4) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar9 = std::operator<<(local_190,"InputFile cannot handle parts of type ");
        psVar5 = Header::type_abi_cxx11_(&this->_data->header);
        std::operator<<(poVar9,(string *)psVar5);
        pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar10,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar10,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    this_02 = (ScanLineInputFile *)operator_new(0x18);
    pDVar2 = this->_data;
    ScanLineInputFile::ScanLineInputFile
              (this_02,&pDVar2->header,pDVar2->_streamData->is,pDVar2->numThreads);
  }
  else {
    if (bVar3) {
      psVar5 = Header::type_abi_cxx11_(&this->_data->header);
      _Var4 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)DEEPSCANLINE_abi_cxx11_);
      if (_Var4) {
        pDVar2 = this->_data;
        pDVar2->isTiled = false;
        pBVar6 = Header::dataWindow(&pDVar2->header);
        pDVar2 = this->_data;
        pDVar2->minY = (pBVar6->min).y;
        pDVar2->maxY = (pBVar6->max).y;
        pDVar7 = (DeepScanLineInputFile *)operator_new(0x10);
        DeepScanLineInputFile::DeepScanLineInputFile(pDVar7,pDVar2->part);
        this->_data->dsFile = pDVar7;
        this_00 = (CompositeDeepScanLine *)operator_new(0x10);
        CompositeDeepScanLine::CompositeDeepScanLine(this_00);
LAB_003dac40:
        pDVar2 = this->_data;
        pDVar2->compositor = this_00;
        CompositeDeepScanLine::addSource(this_00,pDVar2->dsFile);
        return;
      }
    }
    bVar3 = Header::hasType(&this->_data->header);
    if (bVar3) {
      psVar5 = Header::type_abi_cxx11_(&this->_data->header);
      _Var4 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)TILEDIMAGE_abi_cxx11_);
      if (_Var4) {
        pDVar2 = this->_data;
        pDVar2->isTiled = true;
        pLVar8 = Header::lineOrder(&pDVar2->header);
        pDVar2 = this->_data;
        pDVar2->lineOrder = *pLVar8;
        pBVar6 = Header::dataWindow(&pDVar2->header);
        pDVar2 = this->_data;
        pDVar2->minY = (pBVar6->min).y;
        pDVar2->maxY = (pBVar6->max).y;
        this_01 = (TiledInputFile *)operator_new(0x10);
        TiledInputFile::TiledInputFile(this_01,pDVar2->part);
        goto LAB_003dad35;
      }
    }
    bVar3 = Header::hasType(&this->_data->header);
    if (bVar3) {
      psVar5 = Header::type_abi_cxx11_(&this->_data->header);
      _Var4 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)SCANLINEIMAGE_abi_cxx11_);
      if (!_Var4) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar9 = std::operator<<(local_190,"InputFile cannot handle parts of type ");
        psVar5 = Header::type_abi_cxx11_(&this->_data->header);
        std::operator<<(poVar9,(string *)psVar5);
        pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar10,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar10,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    this_02 = (ScanLineInputFile *)operator_new(0x18);
    ScanLineInputFile::ScanLineInputFile(this_02,this->_data->part);
  }
  this->_data->sFile = this_02;
  return;
}

Assistant:

void
InputFile::initialize ()
{
    if (!_data->part)
    {
        if(_data->header.hasType() && _data->header.type()==DEEPSCANLINE)
        {
            _data->isTiled=false;
            const Box2i &dataWindow = _data->header.dataWindow();
            _data->minY = dataWindow.min.y;
            _data->maxY = dataWindow.max.y;
            
            _data->dsFile = new DeepScanLineInputFile (_data->header,
                                               _data->_streamData->is,
                                               _data->version,
                                               _data->numThreads);
            _data->compositor = new CompositeDeepScanLine;
            _data->compositor->addSource(_data->dsFile);
        }
        
        else if (isTiled (_data->version) && !isNonImage(_data->version)) 
        {
            _data->isTiled = true;
            _data->lineOrder = _data->header.lineOrder();

            //
            // Save the dataWindow information
            //
    
            const Box2i &dataWindow = _data->header.dataWindow();
            _data->minY = dataWindow.min.y;
            _data->maxY = dataWindow.max.y;

            _data->tFile = new TiledInputFile (_data->header,
                                               _data->_streamData->is,
                                               _data->version,
                                               _data->numThreads);
        }
        
        else if(!_data->header.hasType() || _data->header.type()==SCANLINEIMAGE)
        {
            _data->sFile = new ScanLineInputFile (_data->header,
                                                  _data->_streamData->is,
                                                  _data->numThreads);
        }else{
            // type set but not recognised
            
            THROW(IEX_NAMESPACE::ArgExc, "InputFile cannot handle parts of type " << _data->header.type());
        }
    }
    else
    {
        if(_data->header.hasType() && _data->header.type()==DEEPSCANLINE)
        {
            _data->isTiled=false;
            const Box2i &dataWindow = _data->header.dataWindow();
            _data->minY = dataWindow.min.y;
            _data->maxY = dataWindow.max.y;
            
            _data->dsFile = new DeepScanLineInputFile (_data->part);
            _data->compositor = new CompositeDeepScanLine;
            _data->compositor->addSource(_data->dsFile);
        }
        else if (_data->header.hasType() && _data->header.type()==TILEDIMAGE)
        {
            _data->isTiled = true;
            _data->lineOrder = _data->header.lineOrder();

            //
            // Save the dataWindow information
            //

            const Box2i &dataWindow = _data->header.dataWindow();
            _data->minY = dataWindow.min.y;
            _data->maxY = dataWindow.max.y;

            _data->tFile = new TiledInputFile (_data->part);
        }
        else if(!_data->header.hasType() || _data->header.type()==SCANLINEIMAGE)
        {
            _data->sFile = new ScanLineInputFile (_data->part);
        }else{
            THROW(IEX_NAMESPACE::ArgExc, "InputFile cannot handle parts of type " << _data->header.type());
            
        }
    }
}